

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGRemoveRedefine
              (xmlRelaxNGParserCtxtPtr ctxt,xmlChar *URL,xmlNodePtr target,xmlChar *name)

{
  xmlHashTablePtr pxVar1;
  long lVar2;
  int iVar3;
  xmlChar *value;
  xmlNodePtr pxVar4;
  xmlNodePtr extraout_RDX;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr target_00;
  xmlNodePtr extraout_RDX_01;
  xmlRelaxNGParserCtxtPtr cur;
  int iVar5;
  
  iVar5 = 0;
  do {
    while( true ) {
      cur = ctxt;
      if (cur == (xmlRelaxNGParserCtxtPtr)0x0) {
        return iVar5;
      }
      ctxt = (xmlRelaxNGParserCtxtPtr)cur->grammar;
      if (URL != (xmlChar *)0x0) break;
      if (((*(long *)&cur->nbWarnings == 0) || (*(int *)&cur->error != 1)) ||
         ((iVar3 = xmlStrEqual((xmlChar *)cur->warning,(xmlChar *)"start"), iVar3 == 0 ||
          (iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)&cur->nbWarnings + 0x10),
                               (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar3 == 0)))) {
LAB_0016f2f6:
        if (((*(long *)&cur->nbWarnings != 0) && (*(int *)&cur->error == 1)) &&
           ((iVar3 = xmlStrEqual((xmlChar *)cur->warning,(xmlChar *)"include"), iVar3 != 0 &&
            (iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)&cur->nbWarnings + 0x10),
                                 (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar3 != 0)))) {
          pxVar1 = cur->interleaves;
          pxVar4 = extraout_RDX;
          if ((((pxVar1 != (xmlHashTablePtr)0x0) && (pxVar1->dict != (xmlDictPtr)0x0)) &&
              (lVar2 = *(long *)&pxVar1->dict->nbElems, lVar2 != 0)) &&
             (iVar3 = xmlStrEqual(*(xmlChar **)(lVar2 + 0x10),"grammar"), pxVar4 = extraout_RDX_00,
             iVar3 != 0)) {
            pxVar4 = xmlDocGetRootElement((xmlDoc *)pxVar1->dict);
            iVar3 = xmlRelaxNGRemoveRedefine
                              ((xmlRelaxNGParserCtxtPtr)pxVar4->children,URL,target_00,name);
            pxVar4 = extraout_RDX_01;
            if (iVar3 == 1) {
              iVar5 = 1;
            }
          }
          iVar3 = xmlRelaxNGRemoveRedefine((xmlRelaxNGParserCtxtPtr)cur->serror,URL,pxVar4,name);
          if (iVar3 == 1) {
            iVar5 = 1;
          }
        }
      }
      else {
        xmlUnlinkNode((xmlNodePtr)cur);
        xmlFreeNode((xmlNodePtr)cur);
        iVar5 = 1;
      }
    }
    if ((((*(long *)&cur->nbWarnings == 0) || (*(int *)&cur->error != 1)) ||
        (iVar3 = xmlStrEqual((xmlChar *)cur->warning,"define"), iVar3 == 0)) ||
       (iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)&cur->nbWarnings + 0x10),
                            (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar3 == 0))
    goto LAB_0016f2f6;
    value = xmlGetProp((xmlNode *)cur,"name");
    xmlRelaxNGNormExtSpace(value);
    if (value != (xmlChar *)0x0) {
      iVar3 = xmlStrEqual(URL,value);
      if (iVar3 != 0) {
        xmlUnlinkNode((xmlNodePtr)cur);
        xmlFreeNode((xmlNodePtr)cur);
        iVar5 = 1;
      }
      (*xmlFree)(value);
    }
  } while( true );
}

Assistant:

static int
xmlRelaxNGRemoveRedefine(xmlRelaxNGParserCtxtPtr ctxt,
                         const xmlChar * URL ATTRIBUTE_UNUSED,
                         xmlNodePtr target, const xmlChar * name)
{
    int found = 0;
    xmlNodePtr tmp, tmp2;
    xmlChar *name2;

#ifdef DEBUG_INCLUDE
    if (name == NULL)
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> start from %s\n", URL);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> define %s from %s\n",
                        name, URL);
#endif
    tmp = target;
    while (tmp != NULL) {
        tmp2 = tmp->next;
        if ((name == NULL) && (IS_RELAXNG(tmp, "start"))) {
            found = 1;
            xmlUnlinkNode(tmp);
            xmlFreeNode(tmp);
        } else if ((name != NULL) && (IS_RELAXNG(tmp, "define"))) {
            name2 = xmlGetProp(tmp, BAD_CAST "name");
            xmlRelaxNGNormExtSpace(name2);
            if (name2 != NULL) {
                if (xmlStrEqual(name, name2)) {
                    found = 1;
                    xmlUnlinkNode(tmp);
                    xmlFreeNode(tmp);
                }
                xmlFree(name2);
            }
        } else if (IS_RELAXNG(tmp, "include")) {
            xmlChar *href = NULL;
            xmlRelaxNGDocumentPtr inc = tmp->psvi;

            if ((inc != NULL) && (inc->doc != NULL) &&
                (inc->doc->children != NULL)) {

                if (xmlStrEqual
                    (inc->doc->children->name, BAD_CAST "grammar")) {
#ifdef DEBUG_INCLUDE
                    href = xmlGetProp(tmp, BAD_CAST "href");
#endif
                    if (xmlRelaxNGRemoveRedefine(ctxt, href,
                                                 xmlDocGetRootElement(inc->doc)->children,
                                                 name) == 1) {
                        found = 1;
                    }
#ifdef DEBUG_INCLUDE
                    if (href != NULL)
                        xmlFree(href);
#endif
                }
            }
            if (xmlRelaxNGRemoveRedefine(ctxt, URL, tmp->children, name) == 1) {
                found = 1;
            }
        }
        tmp = tmp2;
    }
    return (found);
}